

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O1

void __thiscall
S2Loop::EncodeCompressed(S2Loop *this,Encoder *encoder,S2XYZFaceSiTi *vertices,int snap_level)

{
  bool bVar1;
  int iVar2;
  uchar *puVar3;
  uint32 v;
  Span<const_S2XYZFaceSiTi> points;
  S2LogMessage SStack_38;
  
  Encoder::Ensure(encoder,5);
  puVar3 = (uchar *)Varint::Encode32((char *)encoder->buf_,this->num_vertices_);
  encoder->buf_ = puVar3;
  points.len_ = (size_type)this->num_vertices_;
  points.ptr_ = vertices;
  S2EncodePointsCompressed(points,snap_level,encoder);
  bVar1 = this->origin_inside_;
  iVar2 = this->num_vertices_;
  Encoder::Ensure(encoder,10);
  v = bVar1 + 2;
  if (iVar2 < 0x40) {
    v = (uint)bVar1;
  }
  puVar3 = (uchar *)Varint::Encode32((char *)encoder->buf_,v);
  encoder->buf_ = puVar3;
  puVar3 = (uchar *)Varint::Encode32((char *)puVar3,this->depth_);
  encoder->buf_ = puVar3;
  if (0x3f < iVar2) {
    S2LatLngRect::Encode(&this->bound_,encoder);
  }
  if (encoder->buf_ <= encoder->limit_) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&SStack_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/coding/coder.h"
             ,0xf8,kFatal,(ostream *)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>
            (SStack_38.stream_,"Check failed: (limit_) >= (buf_) ",0x21);
  abort();
}

Assistant:

void S2Loop::EncodeCompressed(Encoder* encoder, const S2XYZFaceSiTi* vertices,
                              int snap_level) const {
  // Ensure enough for the data we write before S2EncodePointsCompressed.
  // S2EncodePointsCompressed ensures its space.
  encoder->Ensure(Encoder::kVarintMax32);
  encoder->put_varint32(num_vertices_);

  S2EncodePointsCompressed(MakeSpan(vertices, num_vertices_),
                           snap_level, encoder);

  std::bitset<kNumProperties> properties = GetCompressedEncodingProperties();

  // Ensure enough only for what we write.  Let the bound ensure its own
  // space.
  encoder->Ensure(2 * Encoder::kVarintMax32);
  encoder->put_varint32(properties.to_ulong());
  encoder->put_varint32(depth_);
  if (properties.test(kBoundEncoded)) {
    bound_.Encode(encoder);
  }
  S2_DCHECK_GE(encoder->avail(), 0);
}